

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O0

int WriteMetadataChunk(FILE *out,char *fourcc,MetadataPayload *payload)

{
  int iVar1;
  ulong __size;
  size_t sVar2;
  undefined8 *in_RDX;
  void *in_RSI;
  FILE *in_RDI;
  bool bVar3;
  bool bVar4;
  int ok;
  size_t need_padding;
  uint8_t zero;
  uint32_t in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd1;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 local_19;
  undefined8 *local_18;
  FILE *local_8;
  
  local_19 = 0;
  __size = in_RDX[1] & 1;
  local_18 = in_RDX;
  local_8 = in_RDI;
  sVar2 = fwrite(in_RSI,4,1,in_RDI);
  bVar3 = false;
  if (sVar2 == 1) {
    iVar1 = WriteLE32((FILE *)(ulong)CONCAT14(sVar2 == 1,
                                              (uint)CONCAT12(in_stack_ffffffffffffffd2,
                                                             CONCAT11(in_stack_ffffffffffffffd1,
                                                                      in_stack_ffffffffffffffd0))),
                      in_stack_ffffffffffffffcc);
    bVar3 = iVar1 != 0;
  }
  bVar4 = false;
  if (bVar3) {
    sVar2 = fwrite((void *)*local_18,local_18[1],1,local_8);
    bVar4 = sVar2 == 1;
  }
  bVar3 = false;
  if (bVar4) {
    sVar2 = fwrite(&local_19,__size,__size,local_8);
    bVar3 = sVar2 == __size;
  }
  return (int)bVar3;
}

Assistant:

static int WriteMetadataChunk(FILE* const out, const char fourcc[4],
                              const MetadataPayload* const payload) {
  const uint8_t zero = 0;
  const size_t need_padding = payload->size & 1;
  int ok = (fwrite(fourcc, kTagSize, 1, out) == 1);
  ok = ok && WriteLE32(out, (uint32_t)payload->size);
  ok = ok && (fwrite(payload->bytes, payload->size, 1, out) == 1);
  return ok && (fwrite(&zero, need_padding, need_padding, out) == need_padding);
}